

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient> *this,
          void *pointer)

{
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  *__last;
  undefined8 *puVar1;
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  *__last_00;
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  *pOVar2;
  undefined8 *puVar3;
  allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>
  *in_RDX;
  allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>
  *extraout_RDX;
  allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>
  *extraout_RDX_00;
  _Map_pointer __nfinish;
  undefined8 *puVar4;
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  *__first;
  Fault local_60;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  
  if (pointer != (void *)0x0) {
    _kjCondition.left = (uint *)((long)pointer + 0x14);
    _kjCondition.right = 0;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = *(int *)((long)pointer + 0x14) == 0;
    if (!_kjCondition.result) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[90]>
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x195b,FAILED,"concurrentRequests == 0",
                 "_kjCondition,\"ConcurrencyLimitingHttpClient getting destroyed when concurrent requests \" \"are still active\""
                 ,&_kjCondition,
                 (char (*) [90])
                 "ConcurrencyLimitingHttpClient getting destroyed when concurrent requests are still active"
                );
      Debug::Fault::fatal(&local_60);
    }
    __first = *(Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
                **)((long)pointer + 0x38);
    __last = *(Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
               **)((long)pointer + 0x48);
    puVar1 = *(undefined8 **)((long)pointer + 0x50);
    __last_00 = *(Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
                  **)((long)pointer + 0x58);
    pOVar2 = *(Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
               **)((long)pointer + 0x60);
    puVar3 = *(undefined8 **)((long)pointer + 0x70);
    puVar4 = puVar1;
    while (puVar4 = puVar4 + 1, puVar4 < puVar3) {
      std::
      _Destroy<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,decltype(nullptr)>*,kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,decltype(nullptr)>>
                ((Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
                  *)*puVar4,
                 (Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
                  *)*puVar4 + 0x20,in_RDX);
      in_RDX = extraout_RDX;
    }
    if (puVar1 != puVar3) {
      std::
      _Destroy<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,decltype(nullptr)>*,kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,decltype(nullptr)>>
                (__first,__last,in_RDX);
      in_RDX = extraout_RDX_00;
      __first = pOVar2;
    }
    std::
    _Destroy<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,decltype(nullptr)>*,kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,decltype(nullptr)>>
              (__first,__last_00,in_RDX);
    if (*(long *)((long)pointer + 0x28) != 0) {
      std::
      _Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
      ::_M_destroy_nodes(*(_Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                           **)((long)pointer + 0x50),
                         (_Map_pointer)(*(long *)((long)pointer + 0x70) + 8),__nfinish);
      operator_delete(*(void **)((long)pointer + 0x28),*(long *)((long)pointer + 0x30) << 3);
    }
    Own<kj::Function<void_(unsigned_int,_unsigned_int)>::Iface,_std::nullptr_t>::dispose
              ((Own<kj::Function<void_(unsigned_int,_unsigned_int)>::Iface,_std::nullptr_t> *)
               ((long)pointer + 0x18));
  }
  operator_delete(pointer,0x78);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }